

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_color_sinks-inl.h
# Opt level: O0

shared_ptr<spdlog::logger>
spdlog::stderr_color_st<spdlog::async_factory_impl<(spdlog::async_overflow_policy)0>>
          (string *logger_name,color_mode mode)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  shared_ptr<spdlog::logger> sVar1;
  color_mode *in_stack_00000050;
  string *in_stack_00000058;
  shared_ptr<spdlog::async_logger> *in_stack_ffffffffffffff88;
  element_type *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  this = in_RDI;
  std::__cxx11::string::string(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  async_factory_impl<(spdlog::async_overflow_policy)0>::
  create<spdlog::sinks::ansicolor_stderr_sink<spdlog::details::console_nullmutex>,spdlog::color_mode&>
            (in_stack_00000058,in_stack_00000050);
  std::shared_ptr<spdlog::logger>::shared_ptr<spdlog::async_logger,void>
            ((shared_ptr<spdlog::logger> *)this,in_stack_ffffffffffffff88);
  std::shared_ptr<spdlog::async_logger>::~shared_ptr((shared_ptr<spdlog::async_logger> *)0x6f0ad2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<spdlog::logger>)
         sVar1.super___shared_ptr<spdlog::logger,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SPDLOG_INLINE std::shared_ptr<logger> stderr_color_st(const std::string &logger_name,
                                                      color_mode mode) {
    return Factory::template create<sinks::stderr_color_sink_st>(logger_name, mode);
}